

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int file_open_read(file_t *file,char *filename)

{
  int iVar1;
  undefined1 local_b0 [8];
  stat sb;
  char *filename_local;
  file_t *file_local;
  
  sb.__glibc_reserved[2] = (__syscall_slong_t)filename;
  if (file == (file_t *)0x0) {
    __assert_fail("file != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c",0x36,
                  "int file_open_read(file_t *, char *)");
  }
  if (filename == (char *)0x0) {
    __assert_fail("filename != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c",0x37,
                  "int file_open_read(file_t *, char *)");
  }
  iVar1 = strcmp(filename,"-");
  if (iVar1 == 0) {
    file->fd = 0;
    file->size = 0;
  }
  else {
    iVar1 = open((char *)sb.__glibc_reserved[2],0);
    file->fd = iVar1;
    if (file->fd < 0) {
      perror("open");
      return 0;
    }
    iVar1 = stat((char *)sb.__glibc_reserved[2],(stat *)local_b0);
    if (iVar1 < 0) {
      perror("stat");
      return 0;
    }
    file->size = sb.st_rdev;
  }
  file->offset = 0;
  return 1;
}

Assistant:

int file_open_read(file_t *file, char *filename) {
  assert(file != NULL);
  assert(filename != NULL);

  if (strcmp(filename, "-") == 0) {
    /* read from stdin */
    file->fd   = STDIN_FILENO;
    file->size = 0;
  } else {
    file->fd = open(filename, O_RDONLY);

    if (file->fd < 0) {
      perror("open");
      return 0;
    }

    struct stat sb;
    if (stat(filename, &sb) < 0) {
      perror("stat");
      return 0;
    }
    file->size = (unsigned long)sb.st_size;
  }

  file->offset = 0;

  return 1;
}